

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O0

int AMPLSetOption<double>(AMPLS_MP_Solver *slv,char *name,double v)

{
  SolverOption *pSVar1;
  undefined8 in_XMM0_Qa;
  OptionError *o;
  runtime_error *e;
  exception *anon_var_0;
  SolverOption *opt;
  BasicBackend *be;
  char *in_stack_ffffffffffffff68;
  SolverOptionManager *in_stack_ffffffffffffff70;
  
  AMPLSGetBackend((AMPLS_MP_Solver *)0x6f18cd);
  pSVar1 = mp::SolverOptionManager::GetOption(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  (*pSVar1->_vptr_SolverOption[8])(in_XMM0_Qa);
  return 0;
}

Assistant:

int AMPLSetOption(AMPLS_MP_Solver* slv,
  const char* name, T v) {
  auto be = AMPLSGetBackend(slv);
  try {
    auto opt = be->GetOption(name);
    opt->SetValue(v);
    return 0;
  }
  catch (const mp::OptionError& o) {
    ((AMPLS_MP__internal*)(slv->internal_info_))->msg_extra_.
      push_back(o.what());
    return 1;
  }
  catch (const std::runtime_error& e) {
    ((AMPLS_MP__internal*)(slv->internal_info_))->msg_extra_.
      push_back(e.what());
  }
  catch (const std::exception& ) {
  }
  return 2;
}